

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<double,double>(Thread *this,BinopFunc<double,_double> *f)

{
  Simd<double,_(unsigned_char)__x02_> value;
  double *pdVar1;
  double dVar2;
  byte local_49;
  undefined1 auStack_48 [7];
  u8 i;
  SR result;
  Simd<double,_(unsigned_char)__x02_> lhs;
  Simd<double,_(unsigned_char)__x02_> rhs;
  BinopFunc<double,_double> *f_local;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  for (local_49 = 0; local_49 < 2; local_49 = local_49 + 1) {
    pdVar1 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)(result.v + 1),local_49);
    dVar2 = *pdVar1;
    pdVar1 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)(lhs.v + 1),local_49);
    dVar2 = (*f)(dVar2,*pdVar1);
    pdVar1 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)auStack_48,local_49);
    *pdVar1 = dVar2;
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_48;
  Push<wabt::interp::Simd<double,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}